

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall
Printer_prettyPrintSpacesWrongPlaceNewlines_Test::TestBody
          (Printer_prettyPrintSpacesWrongPlaceNewlines_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  char *pcVar5;
  AssertHelper local_108 [8];
  Message local_100 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar;
  string local_c0 [8];
  string equation6;
  string local_98 [32];
  undefined1 local_78 [8];
  ComponentPtr component6;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  ModelPtr model;
  PrinterPtr printer;
  Printer_prettyPrintSpacesWrongPlaceNewlines_Test *this_local;
  
  libcellml::Printer::create();
  libcellml::Model::create();
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"model",&local_51);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"component",(allocator<char> *)(equation6.field_2._M_local_buf + 0xf));
  libcellml::Component::create((string *)local_78);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)(equation6.field_2._M_local_buf + 0xf));
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,
             "<apply><eq/>\n  <apply><diff/>\n    <bvar><ci>t</ci></bvar>\n    <ci>X</ci>\n  </apply>\n  <apply><minus/>\n    <apply><times/>\n      <ci>alpha_X</ci>\n      <apply><minus/>\n        <cn cellml:units=\"dimensionless\">1</cn>\n        <ci>X</ci>\n      </apply>\n    </apply>\n    <apply><times/>\n      <ci>beta_X</ci>\n      <ci>X</ci>\n    </apply>\n  </apply>\n</apply>\n"
             ,(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_78);
  libcellml::Component::setMath((string *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_78);
  libcellml::Component::appendMath((string *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_78);
  libcellml::Component::appendMath((string *)peVar3);
  peVar4 = std::__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&local_f8,SUB81(peVar4,0));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_d8,"PRETTY_MODEL_STRING","printer->printModel(model)",
             &PRETTY_MODEL_STRING_abi_cxx11_,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(local_100);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              (local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/printer/printer.cpp"
               ,0x3d3,pcVar5);
    testing::internal::AssertHelper::operator=(local_108,local_100);
    testing::internal::AssertHelper::~AssertHelper(local_108);
    testing::Message::~Message(local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  std::__cxx11::string::~string(local_c0);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_78);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  std::shared_ptr<libcellml::Printer>::~shared_ptr
            ((shared_ptr<libcellml::Printer> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Printer, prettyPrintSpacesWrongPlaceNewlines)
{
    auto printer = libcellml::Printer::create();
    auto model = libcellml::Model::create();
    model->setName("model");

    auto component6 = libcellml::Component::create("component");
    model->addComponent(component6);
    const std::string equation6 =
        "<apply><eq/>\n"
        "  <apply><diff/>\n"
        "    <bvar><ci>t</ci></bvar>\n"
        "    <ci>X</ci>\n"
        "  </apply>\n"
        "  <apply><minus/>\n"
        "    <apply><times/>\n"
        "      <ci>alpha_X</ci>\n"
        "      <apply><minus/>\n"
        "        <cn cellml:units=\"dimensionless\">1</cn>\n"
        "        <ci>X</ci>\n"
        "      </apply>\n"
        "    </apply>\n"
        "    <apply><times/>\n"
        "      <ci>beta_X</ci>\n"
        "      <ci>X</ci>\n"
        "    </apply>\n"
        "  </apply>\n"
        "</apply>\n";
    component6->setMath(MATH_HEADER);
    component6->appendMath(equation6);
    component6->appendMath(MATH_FOOTER);
    EXPECT_EQ(PRETTY_MODEL_STRING, printer->printModel(model));
}